

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyRwr.c
# Opt level: O3

void Ivy_GraphUpdateNetwork
               (Ivy_Man_t *p,Ivy_Obj_t *pRoot,Dec_Graph_t *pGraph,int fUpdateLevel,int nGain)

{
  int iVar1;
  int iVar2;
  Ivy_Obj_t *pObjNew;
  int iVar3;
  
  if (fUpdateLevel == 0) {
    iVar3 = 1000000;
  }
  else {
    iVar3 = pRoot->Id;
    if (((long)iVar3 < 0) || (p->vRequired->nSize <= iVar3)) {
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                    ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
    }
    iVar3 = p->vRequired->pArray[iVar3];
  }
  iVar1 = p->nObjs[5];
  iVar2 = p->nObjs[6];
  pObjNew = Ivy_GraphToNetwork(p,pGraph);
  if (iVar3 < (int)(*(uint *)(((ulong)pObjNew & 0xfffffffffffffffe) + 8) >> 0xb)) {
    __assert_fail("(int)Ivy_Regular(pRootNew)->Level <= Required",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/ivy/ivyRwr.c"
                  ,0x20e,
                  "void Ivy_GraphUpdateNetwork(Ivy_Man_t *, Ivy_Obj_t *, Dec_Graph_t *, int, int)");
  }
  Ivy_ObjReplace(p,pRoot,pObjNew,1,0,1);
  if (nGain <= (iVar2 + iVar1) - (p->nObjs[5] + p->nObjs[6])) {
    Ivy_ManPropagateBuffers(p,1);
    return;
  }
  __assert_fail("nGain <= nNodesOld - nNodesNew",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/ivy/ivyRwr.c"
                ,0x21f,
                "void Ivy_GraphUpdateNetwork(Ivy_Man_t *, Ivy_Obj_t *, Dec_Graph_t *, int, int)");
}

Assistant:

void Ivy_GraphUpdateNetwork( Ivy_Man_t * p, Ivy_Obj_t * pRoot, Dec_Graph_t * pGraph, int fUpdateLevel, int nGain )
{
    Ivy_Obj_t * pRootNew;
    int nNodesNew, nNodesOld, Required;
    Required = fUpdateLevel? Vec_IntEntry( p->vRequired, pRoot->Id ) : 1000000;
    nNodesOld = Ivy_ManNodeNum(p);
    // create the new structure of nodes
    pRootNew = Ivy_GraphToNetwork( p, pGraph );
    assert( (int)Ivy_Regular(pRootNew)->Level <= Required );
//    if ( Ivy_Regular(pRootNew)->Level == Required )
//        printf( "Difference %d.\n", Ivy_Regular(pRootNew)->Level - Required );
    // remove the old nodes
//    Ivy_AigReplace( pMan->pManFunc, pRoot, pRootNew, fUpdateLevel );
/*
    if ( Ivy_IsComplement(pRootNew) )
        printf( "c" );
    else
        printf( "d" );
    if ( Ivy_ObjRefs(Ivy_Regular(pRootNew)) > 0 )
        printf( "%d", Ivy_ObjRefs(Ivy_Regular(pRootNew)) );
    printf( " " );
*/
    Ivy_ObjReplace( p, pRoot, pRootNew, 1, 0, 1 );
    // compare the gains
    nNodesNew = Ivy_ManNodeNum(p);
    assert( nGain <= nNodesOld - nNodesNew );
    // propagate the buffer
    Ivy_ManPropagateBuffers( p, 1 );
}